

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O0

type dlib::assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
               (pixel *dest,rgb_alpha_pixel *src)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint temp_b;
  uint temp_g;
  uint temp_r;
  rgb_alpha_pixel *src_local;
  pixel *dest_local;
  
  if (src->alpha == 0xff) {
    dest->red = src->red;
    dest->green = src->green;
    dest->blue = src->blue;
  }
  else {
    bVar1 = src->green;
    bVar2 = src->blue;
    bVar3 = src->alpha;
    bVar4 = src->alpha;
    dest->red = dest->red + (char)((uint)src->alpha * ((uint)src->red - (uint)dest->red) >> 8);
    dest->green = dest->green + (char)((uint)bVar3 * ((uint)bVar1 - (uint)dest->green) >> 8);
    dest->blue = dest->blue + (char)((uint)bVar4 * ((uint)bVar2 - (uint)dest->blue) >> 8);
  }
  return;
}

Assistant:

typename enable_if_c<pixel_traits<P1>::rgb && pixel_traits<P2>::rgb_alpha>::type
        assign(P1& dest, const P2& src) 
        { 
            if (src.alpha == 255)
            {
                dest.red = src.red;
                dest.green = src.green;
                dest.blue = src.blue;
            }
            else
            {
                // perform this assignment using fixed point arithmetic: 
                // dest = src*(alpha/255) + dest*(1 - alpha/255);
                // dest = src*(alpha/255) + dest*1 - dest*(alpha/255);
                // dest = dest*1 + src*(alpha/255) - dest*(alpha/255);
                // dest = dest*1 + (src - dest)*(alpha/255);
                // dest += (src - dest)*(alpha/255);

                unsigned int temp_r = src.red;
                unsigned int temp_g = src.green;
                unsigned int temp_b = src.blue;

                temp_r -= dest.red;
                temp_g -= dest.green;
                temp_b -= dest.blue;

                temp_r *= src.alpha;
                temp_g *= src.alpha;
                temp_b *= src.alpha;

                temp_r >>= 8;
                temp_g >>= 8;
                temp_b >>= 8;

                dest.red += static_cast<unsigned char>(temp_r&0xFF);
                dest.green += static_cast<unsigned char>(temp_g&0xFF);
                dest.blue += static_cast<unsigned char>(temp_b&0xFF);
            }
        }